

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

void __thiscall duckdb::PlanEnumerator::SolveJoinOrderApproximately(PlanEnumerator *this)

{
  double dVar1;
  QueryGraphManager *pQVar2;
  JoinRelationSet *pJVar3;
  reference pvVar4;
  DPJoinNode *pDVar5;
  mapped_type *pmVar6;
  JoinRelationSet *pJVar7;
  InternalException *this_00;
  pointer prVar8;
  idx_t i_1;
  ulong __n;
  size_type __n_00;
  idx_t i;
  ulong uVar9;
  ulong __n_01;
  long lVar10;
  allocator local_b9;
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> join_relations;
  optional_ptr<duckdb::DPJoinNode,_true> best_connection;
  ulong local_98;
  ulong local_90;
  optional_ptr<duckdb::DPJoinNode,_true> smallest_plans [2];
  vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> connection;
  size_t smallest_index [2];
  
  join_relations.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  join_relations.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  join_relations.
  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar9 = 0; pQVar2 = this->query_graph_manager,
      uVar9 < (ulong)((long)(pQVar2->relation_manager).relations.
                            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pQVar2->relation_manager).relations.
                            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    connection.
    super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)JoinRelationSetManager::GetJoinRelation(&pQVar2->set_manager,uVar9);
    ::std::
    vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
    ::emplace_back<std::reference_wrapper<duckdb::JoinRelationSet>>
              ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                *)&join_relations,(reference_wrapper<duckdb::JoinRelationSet> *)&connection);
  }
  do {
    if ((ulong)((long)join_relations.
                      super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)join_relations.
                     super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9) {
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                       *)&join_relations);
      return;
    }
    best_connection.ptr = (DPJoinNode *)0x0;
    local_98 = 0;
    local_90 = 0;
    uVar9 = 0;
    while (__n = uVar9,
          __n < (ulong)((long)join_relations.
                              super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)join_relations.
                              super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar4 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::get<true>
                         (&join_relations,__n);
      pJVar7 = pvVar4->_M_data;
      for (__n_01 = __n + 1; uVar9 = __n + 1,
          __n_01 < (ulong)((long)join_relations.
                                 super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)join_relations.
                                 super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n_01 = __n_01 + 1) {
        pvVar4 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::get<true>
                           (&join_relations,__n_01);
        pJVar3 = pvVar4->_M_data;
        QueryGraphEdges::GetConnections(&connection,this->query_graph,pJVar7,pJVar3);
        if ((connection.
             super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             connection.
             super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((pDVar5 = EmitPair(this,pJVar7,pJVar3,&connection),
            best_connection.ptr == (DPJoinNode *)0x0 ||
            (dVar1 = pDVar5->cost,
            pDVar5 = optional_ptr<duckdb::DPJoinNode,_true>::operator->(&best_connection),
            dVar1 < pDVar5->cost)))) {
          best_connection.ptr = EmitPair(this,pJVar7,pJVar3,&connection);
          local_98 = __n_01;
          local_90 = __n;
        }
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                         *)&connection);
      }
    }
    if (best_connection.ptr == (DPJoinNode *)0x0) {
      smallest_plans[0].ptr = (DPJoinNode *)0x0;
      smallest_plans[1].ptr = (DPJoinNode *)0x0;
      for (__n_00 = 0; __n_00 != 2; __n_00 = __n_00 + 1) {
        pvVar4 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::get<true>
                           (&join_relations,__n_00);
        pmVar6 = ::std::__detail::
                 _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->plans,pvVar4);
        smallest_plans[__n_00].ptr =
             (pmVar6->super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
             super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
        smallest_index[__n_00] = __n_00;
      }
      for (uVar9 = 2;
          uVar9 < (ulong)((long)join_relations.
                                super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                .
                                super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)join_relations.
                                super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                .
                                super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
      {
        pvVar4 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::get<true>
                           (&join_relations,uVar9);
        pmVar6 = ::std::__detail::
                 _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->plans,pvVar4);
        connection.
        super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(pmVar6->
                      super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>
                      .super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
          if (*(long *)((long)&smallest_plans[0].ptr + lVar10) == 0) {
LAB_01a601b0:
            *(pointer *)((long)&smallest_plans[0].ptr + lVar10) =
                 connection.
                 super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)smallest_index + lVar10) = uVar9;
            break;
          }
          pDVar5 = optional_ptr<duckdb::DPJoinNode,_true>::operator->
                             ((optional_ptr<duckdb::DPJoinNode,_true> *)
                              ((long)&smallest_plans[0].ptr + lVar10));
          dVar1 = pDVar5->cost;
          pDVar5 = optional_ptr<duckdb::DPJoinNode,_true>::operator->
                             ((optional_ptr<duckdb::DPJoinNode,_true> *)&connection);
          if (pDVar5->cost <= dVar1 && dVar1 != pDVar5->cost) goto LAB_01a601b0;
        }
      }
      if ((smallest_plans[0].ptr == (DPJoinNode *)0x0) ||
         (smallest_plans[1].ptr == (DPJoinNode *)0x0)) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&connection,"Internal error in join order optimizer",&local_b9);
        InternalException::InternalException(this_00,(string *)&connection);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pDVar5 = optional_ptr<duckdb::DPJoinNode,_true>::operator->(smallest_plans);
      pJVar7 = pDVar5->set;
      pDVar5 = optional_ptr<duckdb::DPJoinNode,_true>::operator->(smallest_plans + 1);
      pJVar3 = pDVar5->set;
      QueryGraphManager::CreateQueryGraphCrossProduct(this->query_graph_manager,pJVar7,pJVar3);
      QueryGraphEdges::GetConnections(&connection,this->query_graph,pJVar7,pJVar3);
      best_connection.ptr = EmitPair(this,pJVar7,pJVar3,&connection);
      local_98 = smallest_index[1];
      if (smallest_index[0] >= smallest_index[1] && smallest_index[0] != smallest_index[1]) {
        local_98 = smallest_index[0];
      }
      local_90 = smallest_index[1];
      if (smallest_index[0] < smallest_index[1]) {
        local_90 = smallest_index[0];
      }
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                       *)&connection);
    }
    pQVar2 = this->query_graph_manager;
    pvVar4 = ::std::
             vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             ::at(&join_relations.
                   super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  ,local_90);
    pJVar7 = pvVar4->_M_data;
    pvVar4 = ::std::
             vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             ::at(&join_relations.
                   super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  ,local_98);
    pJVar7 = JoinRelationSetManager::Union(&pQVar2->set_manager,pJVar7,pvVar4->_M_data);
    prVar8 = join_relations.
             super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_98 + 1;
    if (prVar8 != join_relations.
                  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      memmove(join_relations.
              super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_98,prVar8,
              (long)join_relations.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)prVar8);
    }
    join_relations.
    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         join_relations.
         super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    prVar8 = join_relations.
             super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_90 + 1;
    if (prVar8 != join_relations.
                  super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      memmove(join_relations.
              super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_90,prVar8,
              (long)join_relations.
                    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)prVar8);
    }
    join_relations.
    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         join_relations.
         super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    connection.
    super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pJVar7;
    ::std::
    vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
    ::emplace_back<std::reference_wrapper<duckdb::JoinRelationSet>>
              ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                *)&join_relations,(reference_wrapper<duckdb::JoinRelationSet> *)&connection);
  } while( true );
}

Assistant:

void PlanEnumerator::SolveJoinOrderApproximately() {
	// at this point, we exited the dynamic programming but did not compute the final join order because it took too
	// long instead, we use a greedy heuristic to obtain a join ordering now we use Greedy Operator Ordering to
	// construct the result tree first we start out with all the base relations (the to-be-joined relations)
	vector<reference<JoinRelationSet>> join_relations; // T in the paper
	for (idx_t i = 0; i < query_graph_manager.relation_manager.NumRelations(); i++) {
		join_relations.push_back(query_graph_manager.set_manager.GetJoinRelation(i));
	}
	while (join_relations.size() > 1) {
		// now in every step of the algorithm, we greedily pick the join between the to-be-joined relations that has the
		// smallest cost. This is O(r^2) per step, and every step will reduce the total amount of relations to-be-joined
		// by 1, so the total cost is O(r^3) in the amount of relations
		// long is needed to prevent clang-tidy complaints. (idx_t) cannot be added to an iterator position because it
		// is unsigned.
		idx_t best_left = 0, best_right = 0;
		optional_ptr<DPJoinNode> best_connection;
		for (idx_t i = 0; i < join_relations.size(); i++) {
			auto left = join_relations[i];
			for (idx_t j = i + 1; j < join_relations.size(); j++) {
				auto right = join_relations[j];
				// check if we can connect these two relations
				auto connection = query_graph.GetConnections(left, right);
				if (!connection.empty()) {
					// we can check the cost of this connection
					auto node = EmitPair(left, right, connection);

					// update the DP tree in case a plan created by the DP algorithm uses the node
					// that was potentially just updated by EmitPair. You will get a use-after-free
					// error if future plans rely on the old node that was just replaced.
					// if node in FullPath, then updateDP tree.

					if (!best_connection || node.cost < best_connection->cost) {
						// best pair found so far
						best_connection = &EmitPair(left, right, connection);
						best_left = i;
						best_right = j;
					}
				}
			}
		}
		if (!best_connection) {
			// could not find a connection, but we were not done with finding a completed plan
			// we have to add a cross product; we add it between the two smallest relations
			optional_ptr<DPJoinNode> smallest_plans[2];
			size_t smallest_index[2];
			D_ASSERT(join_relations.size() >= 2);

			// first just add the first two join relations. It doesn't matter the cost as the JOO
			// will swap them on estimated cardinality anyway.
			for (idx_t i = 0; i < 2; i++) {
				optional_ptr<DPJoinNode> current_plan = plans[join_relations[i]];
				smallest_plans[i] = current_plan;
				smallest_index[i] = i;
			}

			// if there are any other join relations that don't have connections
			// add them if they have lower estimated cardinality.
			for (idx_t i = 2; i < join_relations.size(); i++) {
				// get the plan for this relation
				optional_ptr<DPJoinNode> current_plan = plans[join_relations[i]];
				// check if the cardinality is smaller than the smallest two found so far
				for (idx_t j = 0; j < 2; j++) {
					if (!smallest_plans[j] || smallest_plans[j]->cost > current_plan->cost) {
						smallest_plans[j] = current_plan;
						smallest_index[j] = i;
						break;
					}
				}
			}
			if (!smallest_plans[0] || !smallest_plans[1]) {
				throw InternalException("Internal error in join order optimizer");
			}
			D_ASSERT(smallest_plans[0] && smallest_plans[1]);
			D_ASSERT(smallest_index[0] != smallest_index[1]);
			auto &left = smallest_plans[0]->set;
			auto &right = smallest_plans[1]->set;
			// create a cross product edge (i.e. edge with empty filter) between these two sets in the query graph
			query_graph_manager.CreateQueryGraphCrossProduct(left, right);
			// now emit the pair and continue with the algorithm
			auto connections = query_graph.GetConnections(left, right);
			D_ASSERT(!connections.empty());

			best_connection = &EmitPair(left, right, connections);
			best_left = smallest_index[0];
			best_right = smallest_index[1];

			// the code below assumes best_right > best_left
			if (best_left > best_right) {
				std::swap(best_left, best_right);
			}
		}
		// now update the to-be-checked pairs
		// remove left and right, and add the combination

		// important to erase the biggest element first
		// if we erase the smallest element first the index of the biggest element changes
		auto &new_set = query_graph_manager.set_manager.Union(join_relations.at(best_left).get(),
		                                                      join_relations.at(best_right).get());
		D_ASSERT(best_right > best_left);
		join_relations.erase(join_relations.begin() + (int64_t)best_right);
		join_relations.erase(join_relations.begin() + (int64_t)best_left);
		join_relations.push_back(new_set);
	}
}